

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  OPJ_BOOL OVar2;
  opj_tcp_t *local_60;
  opj_image_t *l_image;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  uint local_38;
  OPJ_UINT32 l_nb_stages;
  OPJ_UINT32 i;
  OPJ_UINT32 l_tmp;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  _i = p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e1,
                  "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x18e3,
                    "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    poVar1 = p_j2k->m_private_image;
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      local_60 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      local_60 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    if (p_header_size == 0) {
      opj_event_msg(p_manager,1,"Error reading MCO marker\n");
      p_j2k_local._4_4_ = 0;
    }
    else {
      opj_read_bytes_LE(p_header_data,(OPJ_UINT32 *)((long)&l_tcp + 4),1);
      pOStack_20 = pOStack_20 + 1;
      if (l_tcp._4_4_ < 2) {
        if (p_manager_local._4_4_ == l_tcp._4_4_ + 1) {
          l_image = (opj_image_t *)local_60->tccps;
          for (local_38 = 0; local_38 < poVar1->numcomps; local_38 = local_38 + 1) {
            l_image[0x16].color_space = OPJ_CLRSPC_UNSPECIFIED;
            l_image = (opj_image_t *)&l_image[0x16].comps;
          }
          if (local_60->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
            opj_free(local_60->m_mct_decoding_matrix);
            local_60->m_mct_decoding_matrix = (OPJ_FLOAT32 *)0x0;
          }
          for (local_38 = 0; local_38 < l_tcp._4_4_; local_38 = local_38 + 1) {
            opj_read_bytes_LE(pOStack_20,&l_nb_stages,1);
            pOStack_20 = pOStack_20 + 1;
            OVar2 = opj_j2k_add_mct(local_60,*(opj_image_t **)(p_header_data_local + 0x60),
                                    l_nb_stages);
            if (OVar2 == 0) {
              return 0;
            }
          }
          p_j2k_local._4_4_ = 1;
        }
        else {
          opj_event_msg(_i,2,"Error reading MCO marker\n");
          p_j2k_local._4_4_ = 0;
        }
      }
      else {
        opj_event_msg(_i,2,"Cannot take in charge multiple transformation stages.\n");
        p_j2k_local._4_4_ = 1;
      }
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x18e2,
                "OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mco(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_tmp, i;
    OPJ_UINT32 l_nb_stages;
    opj_tcp_t * l_tcp;
    opj_tccp_t * l_tccp;
    opj_image_t * l_image;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_nb_stages,
                   1);                         /* Nmco : only one transform stage*/
    ++p_header_data;

    if (l_nb_stages > 1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple transformation stages.\n");
        return OPJ_TRUE;
    }

    if (p_header_size != l_nb_stages + 1) {
        opj_event_msg(p_manager, EVT_WARNING, "Error reading MCO marker\n");
        return OPJ_FALSE;
    }

    l_tccp = l_tcp->tccps;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tccp->m_dc_level_shift = 0;
        ++l_tccp;
    }

    if (l_tcp->m_mct_decoding_matrix) {
        opj_free(l_tcp->m_mct_decoding_matrix);
        l_tcp->m_mct_decoding_matrix = 00;
    }

    for (i = 0; i < l_nb_stages; ++i) {
        opj_read_bytes(p_header_data, &l_tmp, 1);
        ++p_header_data;

        if (! opj_j2k_add_mct(l_tcp, p_j2k->m_private_image, l_tmp)) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}